

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O2

void CipherFileTest(FileTest *t)

{
  Span<const_unsigned_char> iv_00;
  Span<const_unsigned_char> plaintext_00;
  Span<const_unsigned_char> ciphertext_00;
  Span<const_unsigned_char> aad_00;
  Span<const_unsigned_char> tag_00;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  EVP_CIPHER *cipher;
  string *__lhs;
  Operation input_op;
  char *in_R9;
  Span<const_unsigned_char> key_00;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  AssertHelper local_180;
  string local_178;
  AssertionResult gtest_ar__2;
  string cipher_str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> plaintext;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tag;
  vector<unsigned_char,_std::allocator<unsigned_char>_> aad;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ciphertext;
  
  cipher_str._M_dataplus._M_p = (pointer)&cipher_str.field_2;
  cipher_str._M_string_length = 0;
  cipher_str.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"Cipher",(allocator<char> *)&iv);
  bVar1 = FileTest::GetAttribute(t,&cipher_str,&local_178);
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar1);
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::~string((string *)&local_178);
  if ((char)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&iv);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)&key,
               (AssertionResult *)"t->GetAttribute(&cipher_str, \"Cipher\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&plaintext,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x1aa,local_178._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&plaintext,(Message *)&iv);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&plaintext);
    std::__cxx11::string::~string((string *)&local_178);
    if (iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    bVar1 = std::operator==(&cipher_str,"DES-CBC");
    if (bVar1) {
      cipher = EVP_des_cbc();
    }
    else {
      bVar1 = std::operator==(&cipher_str,"DES-ECB");
      if (bVar1) {
        cipher = EVP_des_ecb();
      }
      else {
        bVar1 = std::operator==(&cipher_str,"DES-EDE");
        if (bVar1) {
          cipher = EVP_des_ede();
        }
        else {
          bVar1 = std::operator==(&cipher_str,"DES-EDE3");
          if (bVar1) {
            cipher = EVP_des_ede3();
          }
          else {
            bVar1 = std::operator==(&cipher_str,"DES-EDE-CBC");
            if (bVar1) {
              cipher = EVP_des_ede_cbc();
            }
            else {
              bVar1 = std::operator==(&cipher_str,"DES-EDE3-CBC");
              if (bVar1) {
                cipher = EVP_des_ede3_cbc();
              }
              else {
                bVar1 = std::operator==(&cipher_str,"RC4");
                if (bVar1) {
                  cipher = EVP_rc4();
                }
                else {
                  bVar1 = std::operator==(&cipher_str,"AES-128-ECB");
                  if (bVar1) {
                    cipher = EVP_aes_128_ecb();
                  }
                  else {
                    bVar1 = std::operator==(&cipher_str,"AES-256-ECB");
                    if (bVar1) {
                      cipher = EVP_aes_256_ecb();
                    }
                    else {
                      bVar1 = std::operator==(&cipher_str,"AES-128-CBC");
                      if (bVar1) {
                        cipher = EVP_aes_128_cbc();
                      }
                      else {
                        bVar1 = std::operator==(&cipher_str,"AES-128-GCM");
                        if (bVar1) {
                          cipher = EVP_aes_128_gcm();
                        }
                        else {
                          bVar1 = std::operator==(&cipher_str,"AES-128-OFB");
                          if (bVar1) {
                            cipher = EVP_aes_128_ofb();
                          }
                          else {
                            bVar1 = std::operator==(&cipher_str,"AES-192-CBC");
                            if (bVar1) {
                              cipher = EVP_aes_192_cbc();
                            }
                            else {
                              bVar1 = std::operator==(&cipher_str,"AES-192-CTR");
                              if (bVar1) {
                                cipher = EVP_aes_192_ctr();
                              }
                              else {
                                bVar1 = std::operator==(&cipher_str,"AES-192-ECB");
                                if (bVar1) {
                                  cipher = EVP_aes_192_ecb();
                                }
                                else {
                                  bVar1 = std::operator==(&cipher_str,"AES-192-GCM");
                                  if (bVar1) {
                                    cipher = EVP_aes_192_gcm();
                                  }
                                  else {
                                    bVar1 = std::operator==(&cipher_str,"AES-192-OFB");
                                    if (bVar1) {
                                      cipher = EVP_aes_192_ofb();
                                    }
                                    else {
                                      bVar1 = std::operator==(&cipher_str,"AES-256-CBC");
                                      if (bVar1) {
                                        cipher = EVP_aes_256_cbc();
                                      }
                                      else {
                                        bVar1 = std::operator==(&cipher_str,"AES-128-CTR");
                                        if (bVar1) {
                                          cipher = EVP_aes_128_ctr();
                                        }
                                        else {
                                          bVar1 = std::operator==(&cipher_str,"AES-256-CTR");
                                          if (bVar1) {
                                            cipher = EVP_aes_256_ctr();
                                          }
                                          else {
                                            bVar1 = std::operator==(&cipher_str,"AES-256-GCM");
                                            if (bVar1) {
                                              cipher = EVP_aes_256_gcm();
                                            }
                                            else {
                                              bVar1 = std::operator==(&cipher_str,"AES-256-OFB");
                                              if (bVar1) {
                                                cipher = EVP_aes_256_ofb();
                                              }
                                              else {
                                                cipher = (EVP_CIPHER *)0x0;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           cipher != (EVP_CIPHER *)0x0);
    if (cipher != (EVP_CIPHER *)0x0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
      key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"Key",(allocator<char> *)&local_188);
      gtest_ar__2.success_ = FileTest::GetBytes(t,&key,&local_178);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::__cxx11::string::~string((string *)&local_178);
      if (gtest_ar__2.success_ == false) {
        testing::Message::Message((Message *)&local_188);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_178,(internal *)&gtest_ar__2,
                   (AssertionResult *)"t->GetBytes(&key, \"Key\")","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x1af,local_178._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
LAB_00213092:
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        std::__cxx11::string::~string((string *)&local_178);
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_188._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_188._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"Plaintext",(allocator<char> *)&local_188);
        gtest_ar__2.success_ = FileTest::GetBytes(t,&plaintext,&local_178);
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        std::__cxx11::string::~string((string *)&local_178);
        if (gtest_ar__2.success_ == false) {
          testing::Message::Message((Message *)&local_188);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_178,(internal *)&gtest_ar__2,
                     (AssertionResult *)"t->GetBytes(&plaintext, \"Plaintext\")","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x1b0,local_178._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          goto LAB_00213092;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"Ciphertext",(allocator<char> *)&local_188);
        gtest_ar__2.success_ = FileTest::GetBytes(t,&ciphertext,&local_178);
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        std::__cxx11::string::~string((string *)&local_178);
        if (gtest_ar__2.success_ == false) {
          testing::Message::Message((Message *)&local_188);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_178,(internal *)&gtest_ar__2,
                     (AssertionResult *)"t->GetBytes(&ciphertext, \"Ciphertext\")","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x1b1,local_178._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          goto LAB_00213092;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        iVar2 = EVP_CIPHER_iv_length(cipher);
        if (iVar2 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,"IV",(allocator<char> *)&local_188);
          gtest_ar__2.success_ = FileTest::GetBytes(t,&iv,&local_178);
          gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          std::__cxx11::string::~string((string *)&local_178);
          if (gtest_ar__2.success_ == false) {
            testing::Message::Message((Message *)&local_188);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_178,(internal *)&gtest_ar__2,
                       (AssertionResult *)"t->GetBytes(&iv, \"IV\")","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_180,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x1b3,local_178._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
            goto LAB_00213092;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__2.message_);
        }
        uVar3 = EVP_CIPHER_mode((EVP_CIPHER *)cipher);
        if (uVar3 == 6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,"AAD",(allocator<char> *)&local_188);
          gtest_ar__2.success_ = FileTest::GetBytes(t,&aad,&local_178);
          gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          std::__cxx11::string::~string((string *)&local_178);
          if (gtest_ar__2.success_ == false) {
            testing::Message::Message((Message *)&local_188);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_178,(internal *)&gtest_ar__2,
                       (AssertionResult *)"t->GetBytes(&aad, \"AAD\")","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_180,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x1b6,local_178._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__2.message_);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_178,"Tag",(allocator<char> *)&local_188);
            gtest_ar__2.success_ = FileTest::GetBytes(t,&tag,&local_178);
            gtest_ar__2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            std::__cxx11::string::~string((string *)&local_178);
            if (gtest_ar__2.success_ != false) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__2.message_);
              goto LAB_00212bb7;
            }
            testing::Message::Message((Message *)&local_188);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_178,(internal *)&gtest_ar__2,
                       (AssertionResult *)"t->GetBytes(&tag, \"Tag\")","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_180,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x1b7,local_178._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          }
          goto LAB_00213092;
        }
LAB_00212bb7:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"Operation",(allocator<char> *)&gtest_ar__2);
        bVar1 = FileTest::HasAttribute(t,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        input_op = kBoth;
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,"Operation",(allocator<char> *)&gtest_ar__2);
          __lhs = FileTest::GetAttributeOrDie(t,&local_178);
          std::__cxx11::string::~string((string *)&local_178);
          bVar1 = std::operator==(__lhs,"Encrypt");
          input_op = kEncrypt;
          if ((bVar1) || (bVar1 = std::operator==(__lhs,"ENCRYPT"), bVar1)) goto LAB_00212c94;
          bVar1 = std::operator==(__lhs,"Decrypt");
          input_op = kDecrypt;
          if ((bVar1) || (bVar1 = std::operator==(__lhs,"DECRYPT"), bVar1)) goto LAB_00212c94;
          bVar1 = std::operator==(__lhs,"InvalidDecrypt");
          if (bVar1) {
            input_op = kInvalidDecrypt;
            goto LAB_00212c94;
          }
          testing::Message::Message((Message *)&local_178);
          std::operator<<((ostream *)(local_178._M_dataplus._M_p + 0x10),"Unknown operation: ");
          std::operator<<((ostream *)(local_178._M_dataplus._M_p + 0x10),(string *)__lhs);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x1c4,"Failed");
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__2,(Message *)&local_178);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
          if ((long *)local_178._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_178._M_dataplus._M_p + 8))();
          }
        }
        else {
LAB_00212c94:
          key_00.size_ = (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start;
          iv_00.size_ = (long)iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
          iv_00.data_ = iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                        .super__Vector_impl_data._M_start;
          plaintext_00.size_ =
               (long)plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          plaintext_00.data_ =
               plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          ciphertext_00.size_ =
               (long)ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ciphertext_00.data_ =
               ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          aad_00.size_ = (long)aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start;
          aad_00.data_ = aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          tag_00.size_ = (long)tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start;
          tag_00.data_ = tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          key_00.data_ = key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          TestCipher((EVP_CIPHER *)cipher,input_op,false,key_00,iv_00,plaintext_00,ciphertext_00,
                     aad_00,tag_00);
        }
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      goto LAB_0021310c;
    }
    testing::Message::Message((Message *)&iv);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)&key,(AssertionResult *)0x49d3a9,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&plaintext,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x1ac,local_178._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&plaintext,(Message *)&iv);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&plaintext);
    std::__cxx11::string::~string((string *)&local_178);
    if (iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
LAB_0021310c:
  std::__cxx11::string::~string((string *)&cipher_str);
  return;
}

Assistant:

static void CipherFileTest(FileTest *t) {
  std::string cipher_str;
  ASSERT_TRUE(t->GetAttribute(&cipher_str, "Cipher"));
  const EVP_CIPHER *cipher = GetCipher(cipher_str);
  ASSERT_TRUE(cipher);

  std::vector<uint8_t> key, iv, plaintext, ciphertext, aad, tag;
  ASSERT_TRUE(t->GetBytes(&key, "Key"));
  ASSERT_TRUE(t->GetBytes(&plaintext, "Plaintext"));
  ASSERT_TRUE(t->GetBytes(&ciphertext, "Ciphertext"));
  if (EVP_CIPHER_iv_length(cipher) > 0) {
    ASSERT_TRUE(t->GetBytes(&iv, "IV"));
  }
  if (EVP_CIPHER_mode(cipher) == EVP_CIPH_GCM_MODE) {
    ASSERT_TRUE(t->GetBytes(&aad, "AAD"));
    ASSERT_TRUE(t->GetBytes(&tag, "Tag"));
  }

  Operation op = Operation::kBoth;
  if (t->HasAttribute("Operation")) {
    const std::string &str = t->GetAttributeOrDie("Operation");
    if (str == "Encrypt" || str == "ENCRYPT") {
      op = Operation::kEncrypt;
    } else if (str == "Decrypt" || str == "DECRYPT") {
      op = Operation::kDecrypt;
    } else if (str == "InvalidDecrypt") {
      op = Operation::kInvalidDecrypt;
    } else {
      FAIL() << "Unknown operation: " << str;
    }
  }

  TestCipher(cipher, op, /*padding=*/false, key, iv, plaintext, ciphertext, aad,
             tag);
}